

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void renameWalkTrigger(Walker *pWalker,Trigger *pTrigger)

{
  Upsert *pUVar1;
  SrcList *pSVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  TriggerStep *pTVar6;
  Upsert *pUpsert;
  
  if (pTrigger->pWhen != (Expr *)0x0) {
    sqlite3WalkExprNN(pWalker,pTrigger->pWhen);
  }
  for (pTVar6 = pTrigger->step_list; pTVar6 != (TriggerStep *)0x0; pTVar6 = pTVar6->pNext) {
    sqlite3WalkSelect(pWalker,pTVar6->pSelect);
    if (pTVar6->pWhere != (Expr *)0x0) {
      sqlite3WalkExprNN(pWalker,pTVar6->pWhere);
    }
    sqlite3WalkExprList(pWalker,pTVar6->pExprList);
    pUVar1 = pTVar6->pUpsert;
    if (pUVar1 != (Upsert *)0x0) {
      sqlite3WalkExprList(pWalker,pUVar1->pUpsertTarget);
      sqlite3WalkExprList(pWalker,pUVar1->pUpsertSet);
      if (pUVar1->pUpsertWhere != (Expr *)0x0) {
        sqlite3WalkExprNN(pWalker,pUVar1->pUpsertWhere);
      }
      if (pUVar1->pUpsertTargetWhere != (Expr *)0x0) {
        sqlite3WalkExprNN(pWalker,pUVar1->pUpsertTargetWhere);
      }
    }
    pSVar2 = pTVar6->pFrom;
    if (pSVar2 != (SrcList *)0x0) {
      iVar3 = pSVar2->nSrc;
      if (0 < iVar3) {
        pbVar4 = &pSVar2->a[0].fg.field_0x1;
        lVar5 = 0;
        do {
          if ((*pbVar4 & 4) != 0) {
            sqlite3WalkSelect(pWalker,(Select *)**(undefined8 **)(pbVar4 + 0x27));
            iVar3 = pSVar2->nSrc;
          }
          lVar5 = lVar5 + 1;
          pbVar4 = pbVar4 + 0x48;
        } while (lVar5 < iVar3);
      }
    }
  }
  return;
}

Assistant:

static void renameWalkTrigger(Walker *pWalker, Trigger *pTrigger){
  TriggerStep *pStep;

  /* Find tokens to edit in WHEN clause */
  sqlite3WalkExpr(pWalker, pTrigger->pWhen);

  /* Find tokens to edit in trigger steps */
  for(pStep=pTrigger->step_list; pStep; pStep=pStep->pNext){
    sqlite3WalkSelect(pWalker, pStep->pSelect);
    sqlite3WalkExpr(pWalker, pStep->pWhere);
    sqlite3WalkExprList(pWalker, pStep->pExprList);
    if( pStep->pUpsert ){
      Upsert *pUpsert = pStep->pUpsert;
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertTarget);
      sqlite3WalkExprList(pWalker, pUpsert->pUpsertSet);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertWhere);
      sqlite3WalkExpr(pWalker, pUpsert->pUpsertTargetWhere);
    }
    if( pStep->pFrom ){
      int i;
      SrcList *pFrom = pStep->pFrom;
      for(i=0; i<pFrom->nSrc; i++){
        if( pFrom->a[i].fg.isSubquery ){
          assert( pFrom->a[i].u4.pSubq!=0 );
          sqlite3WalkSelect(pWalker, pFrom->a[i].u4.pSubq->pSelect);
        }
      }
    }
  }
}